

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgetopt.c
# Opt level: O0

int sgetoptmine(int argc,char **argv,char *opts)

{
  int iVar1;
  char local_32 [2];
  char *pcStack_30;
  char chp [2];
  char *s;
  int c;
  char *opts_local;
  char **argv_local;
  int argc_local;
  
  if (sgetoptprogname == (char *)0x0) {
    sgetoptprogname = *argv;
    if (sgetoptprogname == (char *)0x0) {
      sgetoptprogname = "";
    }
    for (pcStack_30 = sgetoptprogname; *pcStack_30 != '\0'; pcStack_30 = pcStack_30 + 1) {
      if (*pcStack_30 == '/') {
        sgetoptprogname = pcStack_30 + 1;
      }
    }
  }
  iVar1 = subgetopt(argc,argv,opts);
  if ((sgetopterr != 0) && (iVar1 == 0x3f)) {
    local_32[0] = (char)subgetoptproblem;
    local_32[1] = 10;
    buffer_puts(buffer_2,sgetoptprogname);
    if ((argv[subgetoptind] == (char *)0x0) || (argc <= subgetoptind)) {
      buffer_puts(buffer_2,": option requires an argument -- ");
    }
    else {
      buffer_puts(buffer_2,": illegal option -- ");
    }
    buffer_put(buffer_2,local_32,2);
    buffer_flush(buffer_2);
  }
  return iVar1;
}

Assistant:

int getopt(int argc,const char *const *argv,const char *opts)
{
  int c;
  const char *s;

  if (!optprogname) {
    optprogname = *argv;
    if (!optprogname) optprogname = "";
    for (s = optprogname;*s;++s) if (*s == '/') optprogname = s + 1;
  }
  c = subgetopt(argc,argv,opts);
  if (opterr)
    if (c == '?') {
      char chp[2]; chp[0] = optproblem; chp[1] = '\n';
      buffer_puts(buffer_2,optprogname);
      if (argv[optind] && (optind < argc))
        buffer_puts(buffer_2,": illegal option -- ");
      else
        buffer_puts(buffer_2,": option requires an argument -- ");
      buffer_put(buffer_2,chp,2);
      buffer_flush(buffer_2);
    }
  return c;
}